

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O0

uint __thiscall Memory::HeapBucket::GetBucketIndex(HeapBucket *this)

{
  uint uVar1;
  HeapBucket *this_local;
  
  uVar1 = HeapInfo::GetBucketIndex((ulong)this->sizeCat);
  return uVar1;
}

Assistant:

uint
HeapBucket::GetBucketIndex() const
{
    return HeapInfo::GetBucketIndex(this->sizeCat);
}